

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

potVec * __thiscall OpenMD::Stats::getPotVecError(Stats *this,int index)

{
  reference pvVar1;
  int in_EDX;
  long in_RSI;
  Vector<double,_7U> *in_RDI;
  ResultType *in_stack_00000008;
  PotVecAccumulator *in_stack_00000010;
  potVec *value;
  
  Vector<double,_7U>::Vector(in_RDI);
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),(long)in_EDX);
  if (pvVar1->accumulator != (BaseAccumulator *)0x0) {
    __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
  }
  PotVecAccumulator::get95percentConfidenceInterval(in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

potVec Stats::getPotVecError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    potVec value;
    dynamic_cast<PotVecAccumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return value;
  }